

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_type ggml_ftype_to_ggml_type(ggml_ftype ftype)

{
  undefined4 in_EDI;
  ggml_type wtype;
  ggml_type local_8;
  
  local_8 = GGML_TYPE_COUNT;
  switch(in_EDI) {
  case 0:
    local_8 = GGML_TYPE_F32;
    break;
  case 1:
    local_8 = GGML_TYPE_F16;
    break;
  case 2:
    local_8 = GGML_TYPE_Q4_0;
    break;
  case 3:
    local_8 = GGML_TYPE_Q4_1;
    break;
  case 4:
    local_8 = GGML_TYPE_COUNT;
    break;
  case 7:
    local_8 = GGML_TYPE_Q8_0;
    break;
  case 8:
    local_8 = GGML_TYPE_Q5_0;
    break;
  case 9:
    local_8 = GGML_TYPE_Q5_1;
    break;
  case 10:
    local_8 = GGML_TYPE_Q2_K;
    break;
  case 0xb:
    local_8 = GGML_TYPE_Q3_K;
    break;
  case 0xc:
    local_8 = GGML_TYPE_Q4_K;
    break;
  case 0xd:
    local_8 = GGML_TYPE_Q5_K;
    break;
  case 0xe:
    local_8 = GGML_TYPE_Q6_K;
    break;
  case 0xf:
    local_8 = GGML_TYPE_IQ2_XXS;
    break;
  case 0x10:
    local_8 = GGML_TYPE_IQ2_XS;
    break;
  case 0x11:
    local_8 = GGML_TYPE_IQ3_XXS;
    break;
  case 0x12:
    local_8 = GGML_TYPE_IQ1_S;
    break;
  case 0x13:
    local_8 = GGML_TYPE_IQ4_NL;
    break;
  case 0x14:
    local_8 = GGML_TYPE_IQ3_S;
    break;
  case 0x15:
    local_8 = GGML_TYPE_IQ2_S;
    break;
  case 0x16:
    local_8 = GGML_TYPE_IQ4_XS;
    break;
  case 0x17:
    local_8 = GGML_TYPE_IQ1_M;
    break;
  case 0x18:
    local_8 = GGML_TYPE_BF16;
    break;
  case 0xffffffff:
    local_8 = GGML_TYPE_COUNT;
  }
  if (local_8 == GGML_TYPE_COUNT) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x50c,"GGML_ASSERT(%s) failed","wtype != GGML_TYPE_COUNT");
  }
  return local_8;
}

Assistant:

enum ggml_type ggml_ftype_to_ggml_type(enum ggml_ftype ftype) {
    enum ggml_type wtype = GGML_TYPE_COUNT;

    switch (ftype) {
        case GGML_FTYPE_ALL_F32:              wtype = GGML_TYPE_F32;   break;
        case GGML_FTYPE_MOSTLY_F16:           wtype = GGML_TYPE_F16;   break;
        case GGML_FTYPE_MOSTLY_BF16:          wtype = GGML_TYPE_BF16;  break;
        case GGML_FTYPE_MOSTLY_Q4_0:          wtype = GGML_TYPE_Q4_0;  break;
        case GGML_FTYPE_MOSTLY_Q4_1:          wtype = GGML_TYPE_Q4_1;  break;
        case GGML_FTYPE_MOSTLY_Q5_0:          wtype = GGML_TYPE_Q5_0;  break;
        case GGML_FTYPE_MOSTLY_Q5_1:          wtype = GGML_TYPE_Q5_1;  break;
        case GGML_FTYPE_MOSTLY_Q8_0:          wtype = GGML_TYPE_Q8_0;  break;
        case GGML_FTYPE_MOSTLY_Q2_K:          wtype = GGML_TYPE_Q2_K;  break;
        case GGML_FTYPE_MOSTLY_Q3_K:          wtype = GGML_TYPE_Q3_K;  break;
        case GGML_FTYPE_MOSTLY_Q4_K:          wtype = GGML_TYPE_Q4_K;  break;
        case GGML_FTYPE_MOSTLY_Q5_K:          wtype = GGML_TYPE_Q5_K;  break;
        case GGML_FTYPE_MOSTLY_Q6_K:          wtype = GGML_TYPE_Q6_K;  break;
        case GGML_FTYPE_MOSTLY_IQ2_XXS:       wtype = GGML_TYPE_IQ2_XXS;  break;
        case GGML_FTYPE_MOSTLY_IQ2_XS:        wtype = GGML_TYPE_IQ2_XS;   break;
        case GGML_FTYPE_MOSTLY_IQ3_XXS:       wtype = GGML_TYPE_IQ3_XXS;  break;
        case GGML_FTYPE_MOSTLY_IQ1_S:         wtype = GGML_TYPE_IQ1_S;    break;
        case GGML_FTYPE_MOSTLY_IQ1_M:         wtype = GGML_TYPE_IQ1_M;    break;
        case GGML_FTYPE_MOSTLY_IQ4_NL:        wtype = GGML_TYPE_IQ4_NL;   break;
        case GGML_FTYPE_MOSTLY_IQ4_XS:        wtype = GGML_TYPE_IQ4_XS;   break;
        case GGML_FTYPE_MOSTLY_IQ3_S:         wtype = GGML_TYPE_IQ3_S;    break;
        case GGML_FTYPE_MOSTLY_IQ2_S:         wtype = GGML_TYPE_IQ2_S;    break;
        case GGML_FTYPE_UNKNOWN:              wtype = GGML_TYPE_COUNT; break;
        case GGML_FTYPE_MOSTLY_Q4_1_SOME_F16: wtype = GGML_TYPE_COUNT; break;
    }

    GGML_ASSERT(wtype != GGML_TYPE_COUNT);

    return wtype;
}